

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_moving_multiscale
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL *displaced,REF_DBL *scalar,
          REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
          REF_DBL complexity)

{
  REF_NODE pRVar1;
  uint uVar2;
  REF_DBL *hessian;
  void *__ptr;
  REF_DBL *pRVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  void *pvVar14;
  REF_DBL *pRVar15;
  REF_STATUS RVar16;
  REF_NODE pRVar17;
  REF_DBL __x;
  double dVar18;
  REF_DBL det;
  
  pRVar1 = ref_grid->node;
  uVar8 = (ulong)(uint)pRVar1->max;
  if (pRVar1->max < 0) {
    pcVar13 = "malloc hess of REF_DBL negative";
    uVar9 = 0x9c8;
LAB_001af20b:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar9,
           "ref_metric_moving_multiscale",pcVar13);
    RVar16 = 1;
  }
  else {
    hessian = (REF_DBL *)malloc(uVar8 * 0x30);
    if (hessian == (REF_DBL *)0x0) {
      pcVar13 = "malloc hess of REF_DBL NULL";
      uVar9 = 0x9c8;
    }
    else {
      __ptr = malloc(uVar8 * 0x48);
      if (__ptr == (void *)0x0) {
        pcVar13 = "malloc jac of REF_DBL NULL";
        uVar9 = 0x9c9;
      }
      else {
        pRVar3 = (REF_DBL *)malloc(uVar8 * 8);
        if (pRVar3 == (REF_DBL *)0x0) {
          pcVar13 = "malloc x of REF_DBL NULL";
          uVar9 = 0x9ca;
        }
        else {
          pRVar4 = (REF_DBL *)malloc(uVar8 * 0x18);
          if (pRVar4 == (REF_DBL *)0x0) {
            pcVar13 = "malloc grad of REF_DBL NULL";
            uVar9 = 0x9cb;
          }
          else {
            pvVar14 = __ptr;
            pRVar15 = displaced;
            pRVar17 = pRVar1;
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              if ((int)uVar8 < 1) {
                uVar8 = 0;
              }
              pRVar5 = pRVar15;
              for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
                if (-1 < pRVar17->global[uVar6]) {
                  pRVar3[uVar6] = *pRVar5;
                }
                pRVar5 = pRVar5 + 3;
              }
              uVar2 = ref_recon_gradient(ref_grid,pRVar3,pRVar4,reconstruction);
              if (uVar2 != 0) {
                uVar8 = (ulong)uVar2;
                pcVar13 = "recon x";
                uVar9 = 0x9d1;
                goto LAB_001af49f;
              }
              pRVar17 = ref_grid->node;
              uVar2 = pRVar17->max;
              uVar8 = (ulong)uVar2;
              if (ref_grid->twod == 0) {
                uVar6 = 0;
                if (0 < (int)uVar2) {
                  uVar6 = (ulong)uVar2;
                }
              }
              else {
                uVar6 = 0;
                if (0 < (int)uVar2) {
                  uVar6 = (ulong)uVar2;
                }
                pRVar5 = pRVar4 + 2;
                for (uVar11 = 0; uVar6 != uVar11; uVar11 = uVar11 + 1) {
                  if (-1 < pRVar17->global[uVar11]) {
                    *pRVar5 = 1.0;
                  }
                  pRVar5 = pRVar5 + 3;
                }
              }
              pvVar7 = pvVar14;
              pRVar5 = pRVar4;
              for (uVar11 = 0; uVar11 != uVar6; uVar11 = uVar11 + 1) {
                if (-1 < pRVar17->global[uVar11]) {
                  for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                    *(REF_DBL *)((long)pvVar7 + lVar12 * 8) = pRVar5[lVar12];
                  }
                }
                pRVar5 = pRVar5 + 3;
                pvVar7 = (void *)((long)pvVar7 + 0x48);
              }
              pRVar15 = pRVar15 + 1;
              pvVar14 = (void *)((long)pvVar14 + 0x18);
            }
            free(pRVar4);
            free(pRVar3);
            uVar2 = pRVar17->max;
            if ((int)uVar2 < 0) {
              pcVar13 = "malloc xyz of REF_DBL negative";
              uVar9 = 0x9e0;
              goto LAB_001af20b;
            }
            pvVar14 = malloc((ulong)uVar2 * 0x18);
            if (pvVar14 != (void *)0x0) {
              lVar10 = 0;
              pvVar7 = pvVar14;
              for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
                if (-1 < pRVar17->global[uVar8]) {
                  pRVar3 = pRVar1->real;
                  for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                    *(undefined8 *)((long)pvVar7 + lVar12 * 8) =
                         *(undefined8 *)((long)pRVar3 + lVar12 * 8 + lVar10);
                    *(REF_DBL *)((long)pRVar3 + lVar12 * 8 + lVar10) = displaced[lVar12];
                  }
                }
                lVar10 = lVar10 + 0x78;
                displaced = displaced + 3;
                pvVar7 = (void *)((long)pvVar7 + 0x18);
              }
              uVar2 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction);
              if (uVar2 == 0) {
                pRVar17 = ref_grid->node;
                uVar2 = pRVar17->max;
                uVar6 = 0;
                uVar8 = (ulong)uVar2;
                if ((int)uVar2 < 1) {
                  uVar8 = uVar6;
                }
                pvVar7 = pvVar14;
                for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
                  if (-1 < pRVar17->global[uVar11]) {
                    pRVar3 = pRVar1->real;
                    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                      *(undefined8 *)((long)pRVar3 + lVar10 * 8 + uVar6) =
                           *(undefined8 *)((long)pvVar7 + lVar10 * 8);
                    }
                  }
                  uVar6 = uVar6 + 0x78;
                  pvVar7 = (void *)((long)pvVar7 + 0x18);
                }
                free(pvVar14);
                uVar2 = ref_recon_roundoff_limit(hessian,ref_grid);
                if (uVar2 == 0) {
                  pRVar3 = metric;
                  for (lVar10 = 0; lVar10 < ref_grid->node->max; lVar10 = lVar10 + 1) {
                    if (-1 < ref_grid->node->global[lVar10]) {
                      pRVar4 = (REF_DBL *)(lVar10 * 0x48 + (long)__ptr);
                      uVar2 = ref_matrix_jac_m_jact(pRVar4,hessian + lVar10 * 6,metric + lVar10 * 6)
                      ;
                      if (uVar2 != 0) {
                        uVar8 = (ulong)uVar2;
                        pcVar13 = "J M J^t";
                        uVar9 = 0x9f4;
                        goto LAB_001af49f;
                      }
                      uVar2 = ref_matrix_det_gen(3,pRVar4,&det);
                      if (uVar2 != 0) {
                        uVar8 = (ulong)uVar2;
                        pcVar13 = "gen det";
                        uVar9 = 0x9f6;
                        goto LAB_001af49f;
                      }
                      for (lVar12 = 0; lVar12 != 6; lVar12 = lVar12 + 1) {
                        __x = det;
                        if (det <= -det) {
                          __x = -det;
                        }
                        dVar18 = pow(__x,1.0 / (double)p_norm);
                        pRVar3[lVar12] = dVar18 * pRVar3[lVar12];
                      }
                    }
                    pRVar3 = pRVar3 + 6;
                  }
                  free(__ptr);
                  free(hessian);
                  uVar2 = ref_metric_local_scale(metric,ref_grid,p_norm);
                  if (uVar2 == 0) {
                    uVar2 = ref_metric_gradation_at_complexity(metric,ref_grid,gradation,complexity)
                    ;
                    if (uVar2 == 0) {
                      return 0;
                    }
                    uVar8 = (ulong)uVar2;
                    pcVar13 = "gradation at complexity";
                    uVar9 = 0xa01;
                  }
                  else {
                    uVar8 = (ulong)uVar2;
                    pcVar13 = "local scale lp norm";
                    uVar9 = 0x9fe;
                  }
                }
                else {
                  uVar8 = (ulong)uVar2;
                  pcVar13 = "floor metric eigenvalues based on grid size and solution jitter";
                  uVar9 = 0x9f0;
                }
              }
              else {
                uVar8 = (ulong)uVar2;
                pcVar13 = "recon";
                uVar9 = 0x9e7;
              }
LAB_001af49f:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,uVar9,"ref_metric_moving_multiscale",uVar8,pcVar13);
              return (REF_STATUS)uVar8;
            }
            pcVar13 = "malloc xyz of REF_DBL NULL";
            uVar9 = 0x9e0;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar9,
           "ref_metric_moving_multiscale",pcVar13);
    RVar16 = 2;
  }
  return RVar16;
}

Assistant:

REF_FCN REF_STATUS ref_metric_moving_multiscale(
    REF_DBL *metric, REF_GRID ref_grid, REF_DBL *displaced, REF_DBL *scalar,
    REF_RECON_RECONSTRUCTION reconstruction, REF_INT p_norm, REF_DBL gradation,
    REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *jac, *x, *grad, *hess, *xyz, det;
  REF_INT i, j, node;
  ref_malloc(hess, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(jac, 9 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(x, ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  ref_malloc(grad, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  for (j = 0; j < 3; j++) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      x[node] = displaced[j + 3 * node];
    }
    RSS(ref_recon_gradient(ref_grid, x, grad, reconstruction), "recon x");
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        grad[2 + 3 * node] = 1.0;
      }
    }
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      for (i = 0; i < 3; i++) {
        jac[i + 3 * j + 9 * node] = grad[i + 3 * node];
      }
    }
  }
  ref_free(grad);
  ref_free(x);

  ref_malloc(xyz, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 3; i++) {
      xyz[i + 3 * node] = ref_node_xyz(ref_node, i, node);
      ref_node_xyz(ref_node, i, node) = displaced[i + 3 * node];
    }
  }
  RSS(ref_recon_hessian(ref_grid, scalar, hess, reconstruction), "recon");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 3; i++) {
      ref_node_xyz(ref_node, i, node) = xyz[i + 3 * node];
    }
  }
  ref_free(xyz);

  RSS(ref_recon_roundoff_limit(hess, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_jac_m_jact(&(jac[9 * node]), &(hess[6 * node]),
                              &(metric[6 * node])),
        "J M J^t");

    RSS(ref_matrix_det_gen(3, &(jac[9 * node]), &det), "gen det");
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *= pow(ABS(det), 1.0 / (REF_DBL)p_norm);
    }
  }
  ref_free(jac);
  ref_free(hess);

  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}